

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

NetType cfd::capi::ConvertNetType(int network_type,bool *is_bitcoin)

{
  undefined8 uVar1;
  undefined1 *in_RSI;
  NetType in_EDI;
  NetType net_type;
  string *in_stack_ffffffffffffffa0;
  CfdError in_stack_ffffffffffffffac;
  CfdException *in_stack_ffffffffffffffb0;
  CfdSourceLocation local_30;
  NetType local_14;
  int local_4;
  
  local_14 = kCustomChain;
  if (in_EDI < kLiquidV1) {
    local_14 = in_EDI;
    if (in_RSI != (undefined1 *)0x0) {
      *in_RSI = 1;
    }
  }
  else {
    if (in_EDI == 10) {
      local_14 = kLiquidV1;
    }
    else if (in_EDI == 0xb) {
      local_14 = kElementsRegtest;
    }
    else if (in_EDI != 0xc) {
      local_30.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_common.cpp"
                   ,0x2f);
      local_30.filename = local_30.filename + 1;
      local_30.line = 0x84;
      local_30.funcname = "ConvertNetType";
      core::logger::warn<int&>(&local_30,"Illegal network type.({})",&local_4);
      uVar1 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffb0,"Illegal network type.",
                 (allocator *)&stack0xffffffffffffffaf);
      core::CfdException::CfdException
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
      __cxa_throw(uVar1,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    if (in_RSI != (undefined1 *)0x0) {
      *in_RSI = 0;
    }
  }
  return local_14;
}

Assistant:

NetType ConvertNetType(int network_type, bool* is_bitcoin) {
  NetType net_type = NetType::kCustomChain;
  switch (network_type) {
    case kCfdNetworkMainnet:
    case kCfdNetworkTestnet:
    case kCfdNetworkRegtest:
      net_type = static_cast<NetType>(network_type);
      if (is_bitcoin != nullptr) {
        *is_bitcoin = true;
      }
      break;
    default:
#ifndef CFD_DISABLE_ELEMENTS
      if (network_type == kCfdNetworkLiquidv1) {
        net_type = NetType::kLiquidV1;
      } else if (network_type == kCfdNetworkElementsRegtest) {
        net_type = NetType::kElementsRegtest;
      } else if (network_type == kCfdNetworkCustomChain) {
        // do nothing
      } else {
        warn(CFD_LOG_SOURCE, "Illegal network type.({})", network_type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Illegal network type.");
      }
      if (is_bitcoin != nullptr) {
        *is_bitcoin = false;
      }
      break;
#else
      warn(CFD_LOG_SOURCE, "Illegal network type.({})", network_type);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Illegal network type.");
#endif  // CFD_DISABLE_ELEMENTS
  }
  return net_type;
}